

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::
rangeToString<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (string *__return_storage_ptr__,Detail *this,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> last)

{
  Detail *e;
  ReusableStringStream rss;
  ReusableStringStream local_60;
  string local_48;
  
  ReusableStringStream::ReusableStringStream(&local_60);
  std::operator<<(local_60.m_oss,"{ ");
  if (this != (Detail *)first._M_current) {
    stringify<char>(&local_48,(char *)this);
    std::operator<<(local_60.m_oss,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    for (e = this + 1; e != (Detail *)first._M_current; e = e + 1) {
      std::operator<<(local_60.m_oss,", ");
      stringify<char>(&local_48,(char *)e);
      std::operator<<(local_60.m_oss,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  std::operator<<(local_60.m_oss," }");
  ReusableStringStream::str_abi_cxx11_((string *)__return_storage_ptr__,&local_60);
  ReusableStringStream::~ReusableStringStream(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }